

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4077e::schema_ref::validate
          (schema_ref *this,json_pointer *ptr,json *instance,json_patch *patch,error_handler *e)

{
  shared_ptr<(anonymous_namespace)::schema> target;
  weak_ptr<(anonymous_namespace)::schema> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::weak_ptr<(anonymous_namespace)::schema>::lock(&local_60);
  if (local_60.super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::operator+(&local_50,"unresolved or freed schema-reference ",&this->id_);
    (*e->_vptr_error_handler[2])(e,ptr,instance,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    (*(local_60.super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_schema[3])
              (local_60.super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,ptr,instance,patch,e);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_60.super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &patch, error_handler &e) const final
	{
		auto target = target_.lock();

		if (target)
			target->validate(ptr, instance, patch, e);
		else
			e.error(ptr, instance, "unresolved or freed schema-reference " + id_);
	}